

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall
QGraphicsItem::ensureVisible(QGraphicsItem *this,QRectF *rect,int xmargin,int ymargin)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QRectF local_a8;
  QTransform local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->d_ptr).d)->scene != (QGraphicsScene *)0x0) {
    local_a8.w = 0.0;
    local_a8.h = 0.0;
    local_a8.xp = 0.0;
    local_a8.yp = 0.0;
    if ((((rect->w != 0.0) || (NAN(rect->w))) || (rect->h != 0.0)) || (NAN(rect->h))) {
      sceneTransform(&local_88,this);
      QTransform::mapRect((QRectF *)&local_a8);
    }
    else {
      sceneBoundingRect(&local_a8,this);
    }
    lVar1 = *(long *)&((this->d_ptr).d)->scene->field_0x8;
    lVar2 = *(long *)(lVar1 + 0x288);
    lVar1 = *(long *)(lVar1 + 0x290);
    for (lVar3 = 0; lVar1 << 3 != lVar3; lVar3 = lVar3 + 8) {
      QGraphicsView::ensureVisible(*(QGraphicsView **)(lVar2 + lVar3),&local_a8,xmargin,ymargin);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::ensureVisible(const QRectF &rect, int xmargin, int ymargin)
{
    if (d_ptr->scene) {
        QRectF sceneRect;
        if (!rect.isNull())
            sceneRect = sceneTransform().mapRect(rect);
        else
            sceneRect = sceneBoundingRect();
        for (QGraphicsView *view : std::as_const(d_ptr->scene->d_func()->views))
            view->ensureVisible(sceneRect, xmargin, ymargin);
    }
}